

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlDocPtr doc;
  xmlChar *pxVar2;
  _xmlSAXHandler *p_Var3;
  int *piVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  xmlChar *pxVar8;
  int *piVar9;
  _xmlNode *p_Var10;
  xmlNodePtr pxVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  xmlChar *URI;
  xmlChar *prefix;
  xmlParserNodeInfo node_info;
  xmlChar *local_78;
  xmlChar *local_70;
  _xmlNode *local_68;
  int local_5c;
  xmlParserNodeInfo local_58;
  
  local_70 = (xmlChar *)0x0;
  local_78 = (xmlChar *)0x0;
  iVar14 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    iVar12 = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar1 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
      local_58.begin_line = (unsigned_long)pxVar1->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar13 = -1;
    }
    else {
      iVar13 = -1;
      if (*ctxt->space != -2) {
        iVar13 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar13);
    iVar13 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      pxVar8 = xmlParseStartTag(ctxt);
    }
    else {
      pxVar8 = xmlParseStartTag2(ctxt,&local_70,&local_78,&local_5c);
    }
    pxVar6 = local_70;
    pxVar5 = local_78;
    iVar12 = -1;
    if (ctxt->instate != XML_PARSER_EOF) {
      if (pxVar8 == (xmlChar *)0x0) {
        iVar14 = ctxt->spaceNr;
        if (0 < (long)iVar14) {
          ctxt->spaceNr = iVar14 - 1U;
          piVar4 = ctxt->spaceTab;
          piVar9 = piVar4 + (long)iVar14 + -2;
          if (iVar14 == 1) {
            piVar9 = piVar4;
          }
          ctxt->space = piVar9;
          piVar4[iVar14 - 1U] = -1;
        }
      }
      else {
        nameNsPush(ctxt,pxVar8,local_70,local_78,iVar13,ctxt->nsNr - iVar14);
        p_Var10 = ctxt->node;
        if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
            (doc = ctxt->myDoc, p_Var10 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
           (p_Var10 == doc->children)) {
          local_68 = p_Var10;
          uVar7 = xmlValidateRoot(&ctxt->vctxt,doc);
          ctxt->valid = ctxt->valid & uVar7;
          p_Var10 = local_68;
        }
        pxVar1 = ctxt->input;
        pxVar2 = pxVar1->cur;
        if (*pxVar2 == '>') {
          pxVar1->col = pxVar1->col + 1;
          pxVar1->cur = pxVar2 + 1;
          iVar12 = 0;
          if (pxVar2[1] == '\0') {
            xmlParserInputGrow(pxVar1,0xfa);
            iVar12 = 0;
          }
        }
        else {
          if ((*pxVar2 == '/') && (pxVar2[1] == '>')) {
            pxVar1->cur = pxVar2 + 2;
            pxVar1->col = pxVar1->col + 2;
            if (pxVar2[2] == '\0') {
              xmlParserInputGrow(pxVar1,0xfa);
            }
            p_Var3 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var3 != (_xmlSAXHandler *)0x0) &&
                  (p_Var3->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var3->endElement)(ctxt->userData,pxVar8);
              }
            }
            else if (((p_Var3 != (_xmlSAXHandler *)0x0) &&
                     (p_Var3->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)
                    ) {
              (*p_Var3->endElementNs)(ctxt->userData,pxVar8,pxVar6,pxVar5);
            }
            iVar13 = ctxt->nameNr;
            if (0 < (long)iVar13) {
              ctxt->nameNr = iVar13 - 1U;
              if (iVar13 == 1) {
                pxVar8 = (xmlChar *)0x0;
              }
              else {
                pxVar8 = ctxt->nameTab[(long)iVar13 + -2];
              }
              ctxt->name = pxVar8;
              ctxt->nameTab[iVar13 - 1U] = (xmlChar *)0x0;
            }
            iVar13 = ctxt->spaceNr;
            if (0 < (long)iVar13) {
              ctxt->spaceNr = iVar13 - 1U;
              piVar4 = ctxt->spaceTab;
              piVar9 = piVar4 + (long)iVar13 + -2;
              if (iVar13 == 1) {
                piVar9 = piVar4;
              }
              ctxt->space = piVar9;
              piVar4[iVar13 - 1U] = -1;
            }
            iVar14 = ctxt->nsNr - iVar14;
            if (iVar14 != 0) {
              nsPop(ctxt,iVar14);
            }
            iVar12 = 1;
            if (p_Var10 == (_xmlNode *)0x0) {
              return 1;
            }
            if (ctxt->record_info == 0) {
              return 1;
            }
            pxVar1 = ctxt->input;
            local_58.end_pos =
                 (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
            iVar14 = pxVar1->line;
          }
          else {
            xmlFatalErrMsgStrIntStr
                      (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",
                       pxVar8,iVar13,(xmlChar *)0x0);
            iVar13 = ctxt->nodeNr;
            if (0 < (long)iVar13) {
              ctxt->nodeNr = iVar13 - 1U;
              if (iVar13 == 1) {
                pxVar11 = (xmlNodePtr)0x0;
              }
              else {
                pxVar11 = ctxt->nodeTab[(long)iVar13 + -2];
              }
              ctxt->node = pxVar11;
              ctxt->nodeTab[iVar13 - 1U] = (xmlNodePtr)0x0;
            }
            iVar13 = ctxt->nameNr;
            if (0 < (long)iVar13) {
              ctxt->nameNr = iVar13 - 1U;
              if (iVar13 == 1) {
                pxVar8 = (xmlChar *)0x0;
              }
              else {
                pxVar8 = ctxt->nameTab[(long)iVar13 + -2];
              }
              ctxt->name = pxVar8;
              ctxt->nameTab[iVar13 - 1U] = (xmlChar *)0x0;
            }
            iVar13 = ctxt->spaceNr;
            if (0 < (long)iVar13) {
              ctxt->spaceNr = iVar13 - 1U;
              piVar4 = ctxt->spaceTab;
              piVar9 = piVar4 + (long)iVar13 + -2;
              if (iVar13 == 1) {
                piVar9 = piVar4;
              }
              ctxt->space = piVar9;
              piVar4[iVar13 - 1U] = -1;
            }
            iVar14 = ctxt->nsNr - iVar14;
            if (iVar14 != 0) {
              nsPop(ctxt,iVar14);
            }
            if (p_Var10 == (_xmlNode *)0x0) {
              return -1;
            }
            if (ctxt->record_info == 0) {
              return -1;
            }
            pxVar1 = ctxt->input;
            local_58.end_pos =
                 (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
            iVar14 = pxVar1->line;
          }
          local_58.end_line = (unsigned_long)iVar14;
          local_58.node = p_Var10;
          xmlParserAddNodeInfo(ctxt,&local_58);
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, ctxt->nsNr - nsNr);
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);

	/*
	 * Capture end position and add node
	 */
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(-1);
    }

    return(0);
}